

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsonChain.cpp
# Opt level: O1

Value * __thiscall xmrig::JsonChain::getArray(JsonChain *this,char *key)

{
  Number in_RAX;
  pointer pGVar1;
  Value *unaff_R15;
  bool bVar2;
  undefined8 local_38;
  
  pGVar1 = (this->m_chain).
           super__Vector_base<rapidjson::GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>,_std::allocator<rapidjson::GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_38 = in_RAX;
  do {
    if (pGVar1 == (this->m_chain).
                  super__Vector_base<rapidjson::GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>,_std::allocator<rapidjson::GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>_>_>
                  ._M_impl.super__Vector_impl_data._M_start) {
      return (Value *)kNullValue;
    }
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    FindMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                *)&stack0xffffffffffffffc8,(Ch *)(pGVar1 + -1));
    if (local_38 ==
        (ulong)pGVar1[-1].
               super_GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               .data_.s.length * 0x20 +
        ((ulong)pGVar1[-1].
                super_GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                .data_.s.str & 0xffffffffffff)) {
      bVar2 = true;
    }
    else {
      bVar2 = *(short *)(local_38 + 0x1e) != 4;
      if (!bVar2) {
        unaff_R15 = (Value *)(local_38 + 0x10);
      }
    }
    pGVar1 = pGVar1 + -1;
  } while (bVar2);
  return unaff_R15;
}

Assistant:

const rapidjson::Value &xmrig::JsonChain::getArray(const char *key) const
{
    for (auto it = m_chain.rbegin(); it != m_chain.rend(); ++it) {
        auto i = it->FindMember(key);
        if (i != it->MemberEnd() && i->value.IsArray()) {
            return i->value;
        }
    }

    return kNullValue;
}